

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitTryTable(InternalAnalyzer *this,TryTable *curr)

{
  ArenaVector<wasm::Name> *pAVar1;
  Name *pNVar2;
  undefined1 auStack_58 [8];
  Name name;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  __begin2.parent = (ArenaVector<wasm::Name> *)0x0;
  pAVar1 = *(ArenaVector<wasm::Name> **)(curr + 0x40);
  local_40 = (undefined1  [8])(curr + 0x38);
  while ((__begin2.parent != pAVar1 || (local_40 != (undefined1  [8])(curr + 0x38)))) {
    pNVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                       ((Iterator *)local_40);
    auStack_58 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    std::
    _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
    ::_M_insert_unique<wasm::Name_const&>
              ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                *)&this->parent->breakTargets,(Name *)auStack_58);
    __begin2.parent = __begin2.parent + 1;
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
      for (auto name : curr->catchDests) {
        parent.breakTargets.insert(name);
      }
    }